

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall pugi::xml_document::reset(xml_document *this,xml_document *proto)

{
  xml_node_struct *pxVar1;
  xml_node_struct **ppxVar2;
  xml_node local_18;
  
  reset(this);
  pxVar1 = (proto->super_xml_node)._root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    ppxVar2 = &pxVar1->first_child;
    while( true ) {
      pxVar1 = *ppxVar2;
LAB_0011ea4b:
      if (pxVar1 == (xml_node_struct *)0x0) break;
      local_18._root = pxVar1;
      xml_node::append_copy(&this->super_xml_node,&local_18);
      ppxVar2 = &pxVar1->next_sibling;
    }
    return;
  }
  pxVar1 = (xml_node_struct *)0x0;
  goto LAB_0011ea4b;
}

Assistant:

PUGI__FN void xml_document::reset(const xml_document& proto)
	{
		reset();

		for (xml_node cur = proto.first_child(); cur; cur = cur.next_sibling())
			append_copy(cur);
	}